

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

void * __thiscall
absl::debugging_internal::ElfMemImage::GetSymAddr(ElfMemImage *this,Elf64_Sym *sym)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  
  if ((ushort)(sym->st_shndx + 0x100) < 0x101) {
    pvVar2 = (void *)sym->st_value;
  }
  else {
    uVar3 = this->link_base_;
    uVar1 = sym->st_value;
    if (uVar1 <= uVar3) {
      raw_logging_internal::RawLog
                (kFatal,"elf_mem_image.cc",0x7d,"Check %s failed: %s","link_base_ < sym->st_value",
                 "symbol out of range");
      uVar1 = sym->st_value;
      uVar3 = this->link_base_;
    }
    pvVar2 = (void *)((uVar1 - uVar3) + (long)this->ehdr_);
  }
  return pvVar2;
}

Assistant:

const void *ElfMemImage::GetSymAddr(const ElfW(Sym) *sym) const {
  if (sym->st_shndx == SHN_UNDEF || sym->st_shndx >= SHN_LORESERVE) {
    // Symbol corresponds to "special" (e.g. SHN_ABS) section.
    return reinterpret_cast<const void *>(sym->st_value);
  }
  ABSL_RAW_CHECK(link_base_ < sym->st_value, "symbol out of range");
  return GetTableElement<char>(ehdr_, 0, 1, sym->st_value - link_base_);
}